

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O1

void __thiscall sophia_interface::LUEDIT(sophia_interface *this,int MEDIT)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int (*paiVar7) [4000];
  int iVar8;
  double (*padVar9) [4000];
  int iVar10;
  int aiVar11 [2];
  sophia_interface *psVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  double (*padVar21) [4000];
  ulong uVar22;
  int *piVar23;
  double *pdVar24;
  long lVar25;
  int *piVar26;
  int iVar27;
  int iVar28;
  int *piVar29;
  long lVar30;
  bool bVar31;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  int (*local_88) [4000];
  double (*local_80) [4000];
  double dStack_78;
  double PTS [2];
  double PLS [2];
  int NS [2];
  
  if (((uint)MEDIT < 4) || (MEDIT == 5)) {
    uVar4 = MSTU[1];
    if (MSTU[1] < 1) {
      uVar4 = this->N;
    }
    uVar5 = 1;
    if (1 < MSTU[0]) {
      uVar5 = MSTU[0];
    }
    uVar15 = uVar5 - 1;
    uVar18 = (ulong)uVar15;
    if ((int)uVar5 <= (int)uVar4) {
      uVar6 = (ulong)uVar5;
      uVar22 = uVar6 - 1;
      lVar25 = (long)(this->K + -1) + 0x3e7c + uVar6 * 4;
      local_88 = this->K;
      pdVar24 = this->V[-1] + uVar6 + 3999;
      local_80 = this->P;
      aiVar11[0] = MEDIT - 1;
      aiVar11[1] = 0;
      psVar12 = this;
      NS = aiVar11;
      do {
        iVar28 = this->K[0][uVar22];
        if (0x14 < iVar28 || iVar28 == 0) goto LAB_0010dbb7;
        if (aiVar11[0] < 5) {
          switch((long)&switchD_0010da2d::switchdataD_0012d6a4 +
                 (long)(int)(&switchD_0010da2d::switchdataD_0012d6a4)[(long)aiVar11]) {
          case 0x10da2f:
            if (iVar28 < 0xb) goto switchD_0010da2d_caseD_10db5a;
            break;
          case 0x10da3e:
            if (iVar28 < 0xb) {
              iVar28 = this->K[1][uVar22];
              iVar27 = LUCOMP(psVar12,iVar28);
              aiVar11 = NS;
              if (iVar27 != 0) {
                if (KCHG[0][(long)iVar27 + 499] == 0) {
                  uVar5 = LUCHGE(psVar12,iVar28);
                  goto joined_r0x0010daa4;
                }
                goto switchD_0010da2d_caseD_10db5a;
              }
            }
            break;
          case 0x10daaf:
            if (iVar28 < 0xb) {
              uVar5 = LUCOMP(psVar12,this->K[1][uVar22]);
              uVar5 = uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f;
              aiVar11 = NS;
              if (3 < uVar5 - 6) {
joined_r0x0010daa4:
                aiVar11 = NS;
                if (uVar5 != 0) goto switchD_0010da2d_caseD_10db5a;
              }
            }
            break;
          case 0x10dadc:
            if ((1 < iVar28 - 0xdU) &&
               (iVar27 = LUCOMP(psVar12,this->K[1][uVar22]), aiVar11 = NS, iVar27 != 0)) {
              if (10 < iVar28) {
                uVar5 = KCHG[0][(long)iVar27 + 499];
                goto joined_r0x0010daa4;
              }
              goto switchD_0010da2d_caseD_10db5a;
            }
            break;
          case 0x10db5a:
            goto switchD_0010da2d_caseD_10db5a;
          }
        }
        else {
switchD_0010da2d_caseD_10db5a:
          lVar13 = 0;
          do {
            psVar12 = (sophia_interface *)(ulong)*(uint *)(lVar25 + lVar13);
            *(uint *)((long)*local_88 + lVar13 + uVar18 * 4) = *(uint *)(lVar25 + lVar13);
            *(undefined8 *)((long)*local_80 + lVar13 * 2 + uVar18 * 8) =
                 *(undefined8 *)((long)pdVar24 + lVar13 * 2 + -160000);
            *(undefined8 *)((long)local_80[5] + lVar13 * 2 + uVar18 * 8) =
                 *(undefined8 *)((long)pdVar24 + lVar13 * 2);
            lVar13 = lVar13 + 16000;
          } while (lVar13 != 80000);
          this->K[2][uVar18] = 0;
          uVar18 = (ulong)((int)uVar18 + 1);
        }
LAB_0010dbb7:
        uVar15 = (uint)uVar18;
        uVar22 = uVar22 + 1;
        lVar25 = lVar25 + 4;
        pdVar24 = pdVar24 + 1;
      } while (uVar22 != uVar4);
    }
    if ((int)uVar15 < this->N) {
      MSTU[2] = 0;
    }
    if ((int)uVar15 < this->N) {
      MSTU[0x45] = 0;
    }
    this->N = uVar15;
  }
  else if (MEDIT - 0xbU < 5) {
    iVar28 = this->N;
    if (0 < (long)iVar28) {
      lVar25 = 0;
      iVar27 = 0;
      do {
        iVar8 = this->K[2][lVar25] % MSTU[4];
        this->K[2][lVar25] = iVar8;
        switch(MEDIT - 0xbU) {
        case 0:
          if (this->K[0][lVar25] < 0) goto LAB_0010dcf7;
          switch(MEDIT) {
          case 0xc:
            goto switchD_0010dc67_caseD_1;
          case 0xd:
            goto switchD_0010dc67_caseD_2;
          case 0xe:
            goto switchD_0010dc67_caseD_3;
          case 0xf:
            goto switchD_0010dc67_caseD_4;
          }
          break;
        case 1:
switchD_0010dc67_caseD_1:
          if (this->K[0][lVar25] == 0) goto LAB_0010dcf7;
          if (MEDIT == 0xf) goto switchD_0010dc67_caseD_4;
          if (MEDIT == 0xe) goto switchD_0010dc67_caseD_3;
          if (MEDIT == 0xd) goto switchD_0010dc67_caseD_2;
          break;
        case 2:
switchD_0010dc67_caseD_2:
          uVar4 = this->K[0][lVar25];
          if (((uVar4 < 0x10) && ((0x9800U >> (uVar4 & 0x1f) & 1) != 0)) &&
             (this->K[1][lVar25] != 0x5e)) goto LAB_0010dcf7;
          if (MEDIT == 0xf) goto switchD_0010dc67_caseD_4;
          if (MEDIT == 0xe) goto switchD_0010dc67_caseD_3;
          break;
        case 3:
switchD_0010dc67_caseD_3:
          if ((this->K[0][lVar25] - 0xdU < 2) || (this->K[1][lVar25] == 0x5e)) goto LAB_0010dcf7;
          if (MEDIT == 0xf) goto switchD_0010dc67_caseD_4;
          break;
        case 4:
switchD_0010dc67_caseD_4:
          if (this->K[0][lVar25] < 0x15) break;
          goto LAB_0010dcf7;
        }
        iVar27 = iVar27 + 1;
        this->K[2][lVar25] = MSTU[4] * iVar27 + iVar8;
LAB_0010dcf7:
        lVar25 = lVar25 + 1;
      } while (iVar28 != lVar25);
    }
    if (0 < iVar28) {
      uVar18 = 1;
      do {
        if (0xffffffeb < *(int *)((long)(this->K + -1) + 0x3e7c + uVar18 * 4) - 0x15U) {
          iVar27 = this->K[1][uVar18 + 3999];
          if (iVar27 / MSTU[4] != 0) {
            uVar22 = uVar18 & 0xffffffff;
            do {
              uVar6 = (long)this->K[1][(long)(int)uVar22 + 3999] % (long)MSTU[4];
              iVar8 = (int)uVar6;
              if (iVar28 < iVar8 || (iVar8 < 1 || MEDIT != 0xd)) {
                if (((MEDIT == 0xe && 0 < iVar8) && iVar8 <= iVar28) &&
                   ((this->K[0][iVar8 - 1U] - 0xdU < 2 || (this->K[1][iVar8 - 1U] == 0x5e)))) {
                  bVar31 = true;
                  uVar22 = uVar6 & 0xffffffff;
                }
                else {
                  bVar31 = false;
                }
              }
              else {
                uVar4 = this->K[0][iVar8 - 1U];
                bVar31 = false;
                if (((uVar4 < 0x10) && ((0x9800U >> (uVar4 & 0x1f) & 1) != 0)) &&
                   (bVar31 = this->K[1][iVar8 - 1U] != 0x5e, bVar31)) {
                  uVar22 = uVar6 & 0xffffffff;
                }
              }
            } while (bVar31);
            iVar27 = iVar27 - iVar27 % MSTU[4];
            this->K[1][uVar18 + 3999] = iVar27;
            if (iVar8 != 0) {
              this->K[1][uVar18 + 3999] = this->K[1][(long)iVar8 + 3999] / MSTU[4] + iVar27;
            }
            uVar4 = *(uint *)((long)(this->K + -1) + 0x3e7c + uVar18 * 4);
            if ((uVar4 < 0xf) && ((0x6008U >> (uVar4 & 0x1f) & 1) != 0)) {
              iVar27 = this->K[2][uVar18 + 3999];
              iVar10 = iVar27 % MSTU[4];
              iVar8 = (int)((long)((ulong)(uint)((int)((long)iVar27 / (long)MSTU[4]) >> 0x1f) <<
                                   0x20 | (long)iVar27 / (long)MSTU[4] & 0xffffffffU) %
                           (long)MSTU[4]);
              if (iVar8 <= MSTU[3] && 0 < iVar8) {
                iVar8 = this->K[2][iVar8 - 1] / MSTU[4];
              }
              if (iVar10 <= MSTU[3] && 0 < iVar10) {
                iVar10 = this->K[2][iVar10 - 1] / MSTU[4];
              }
              this->K[2][uVar18 + 3999] =
                   (iVar27 + iVar10 + iVar8 * MSTU[4]) - iVar27 % (MSTU[4] * MSTU[4]);
              iVar27 = this->K[3][uVar18 + 3999];
              iVar10 = iVar27 % MSTU[4];
              iVar8 = (int)((long)((ulong)(uint)((int)((long)iVar27 / (long)MSTU[4]) >> 0x1f) <<
                                   0x20 | (long)iVar27 / (long)MSTU[4] & 0xffffffffU) %
                           (long)MSTU[4]);
              if (iVar8 <= MSTU[3] && 0 < iVar8) {
                iVar8 = this->K[2][iVar8 - 1] / MSTU[4];
              }
              if (iVar10 <= MSTU[3] && 0 < iVar10) {
                iVar10 = this->K[2][iVar10 - 1] / MSTU[4];
              }
              this->K[3][uVar18 + 3999] =
                   (iVar27 + iVar10 + iVar8 * MSTU[4]) - iVar27 % (MSTU[4] * MSTU[4]);
            }
            else {
              iVar27 = this->K[2][uVar18 + 3999];
              if ((0 < iVar27) && (iVar27 <= MSTU[3])) {
                this->K[2][uVar18 + 3999] = this->K[2][iVar27 - 1] / MSTU[4];
              }
              iVar27 = this->K[3][uVar18 + 3999];
              if ((0 < iVar27) && (iVar27 <= MSTU[3])) {
                this->K[3][uVar18 + 3999] = this->K[2][iVar27 - 1] / MSTU[4];
              }
            }
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != iVar28 + 1);
    }
    iVar27 = MSTU[0x59];
    uVar18 = (ulong)(uint)MSTU[0x59];
    MSTU[0x59] = 0;
    iVar28 = this->N;
    if (iVar28 < 1) {
      iVar8 = 0;
    }
    else {
      padVar9 = this->P;
      lVar25 = 0;
      iVar8 = 0;
      padVar21 = padVar9;
      paiVar7 = this->K;
      do {
        if (this->K[2][lVar25] / MSTU[4] != 0) {
          lVar13 = (long)iVar8;
          lVar30 = 0;
          do {
            *(undefined4 *)((long)this->K[0] + lVar30 + lVar13 * 4) =
                 *(undefined4 *)((long)*paiVar7 + lVar30);
            *(undefined8 *)((long)*padVar9 + lVar30 * 2 + lVar13 * 8) =
                 *(undefined8 *)((long)*padVar21 + lVar30 * 2);
            *(undefined8 *)((long)padVar9[5] + lVar30 * 2 + lVar13 * 8) =
                 *(undefined8 *)((long)padVar21[5] + lVar30 * 2);
            lVar30 = lVar30 + 16000;
          } while (lVar30 != 80000);
          iVar8 = iVar8 + 1;
          this->K[2][lVar13] = this->K[2][lVar13] % MSTU[4];
          if (0 < iVar27) {
            uVar22 = 0;
            do {
              if (lVar25 + 1U == (ulong)(uint)MSTU[uVar22 + 0x5a]) {
                lVar13 = (long)MSTU[0x59];
                MSTU[0x59] = MSTU[0x59] + 1;
                MSTU[lVar13 + 0x5a] = iVar8;
                PARU[(long)MSTU[0x59] + 0x59] = PARU[uVar22 + 0x5a];
              }
              uVar22 = uVar22 + 1;
            } while (uVar18 != uVar22);
          }
        }
        lVar25 = lVar25 + 1;
        iVar28 = this->N;
        paiVar7 = (int (*) [4000])(*paiVar7 + 1);
        padVar21 = (double (*) [4000])(*padVar21 + 1);
      } while (lVar25 < iVar28);
    }
    if (iVar8 < iVar28) {
      MSTU[2] = 0;
    }
    if (iVar8 < this->N) {
      MSTU[0x45] = 0;
    }
    this->N = iVar8;
  }
  else {
    switch(MEDIT) {
    case 0x10:
      if (0 < this->N) {
        uVar4 = 1;
        do {
          lVar25 = (long)(int)uVar4;
          uVar5 = uVar4;
          if (((0xfffffff5 < *(int *)((long)(this->K + -1) + 0x3e7c + lVar25 * 4) - 0x15U) &&
              (this->K[2][lVar25 + 3999] == 0)) && (this->K[3][lVar25 + 3999] == 0)) {
            piVar26 = this->K[2] + lVar25 + 3999;
            piVar29 = this->K[3] + lVar25 + 3999;
            if ((int)uVar4 < this->N) {
              lVar13 = (long)(int)uVar4;
              uVar15 = uVar4;
              do {
                uVar15 = uVar15 + 1;
                if (this->K[2][lVar13] == uVar4) {
                  piVar23 = piVar29;
                  if (*piVar26 == 0) {
                    piVar23 = piVar26;
                  }
                  *piVar23 = uVar15;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 < this->N);
            }
            if (*piVar29 == 0) {
              *piVar29 = *piVar26;
            }
            if (((*piVar26 == 0) && (uVar15 = this->K[1][lVar25 + 3999], 0 < (int)uVar15)) &&
               ((((int)uVar15 < (int)uVar4 &&
                 ((uVar1 = uVar15 - 1, 0xfffffff5 < this->K[0][uVar1] - 0x1fU &&
                  (this->K[1][uVar1] == this->K[0][lVar25 + 3999])))) &&
                (ABS(this->P[4][uVar1] - this->P[3][lVar25 + 3999]) <= 0.01)))) {
              lVar13 = lVar25;
              uVar1 = uVar4 + 1;
              if ((int)uVar4 < this->N) {
                do {
                  if (this->K[2][lVar13] == uVar15) {
                    piVar23 = piVar29;
                    if (*piVar26 == 0) {
                      piVar23 = piVar26;
                    }
                    *piVar23 = uVar1;
                  }
                  lVar13 = lVar13 + 1;
                  uVar1 = uVar1 + 1;
                } while (lVar13 < this->N);
              }
              if (*piVar29 == 0) {
                *piVar29 = *piVar26;
              }
              if (*piVar26 == 0) {
                iVar28 = uVar15 + 1;
                uVar1 = uVar15;
                uVar20 = uVar15;
                uVar17 = uVar15;
                while (iVar28 < (int)uVar4) {
                  if (((this->K[2][uVar1] == uVar15) && (this->K[0][uVar1] - 0x15U < 10)) &&
                     (uVar20 = uVar1 + 1, uVar17 == uVar15)) {
                    uVar17 = uVar20;
                  }
                  iVar28 = uVar1 + 2;
                  uVar1 = uVar1 + 1;
                }
                if ((int)uVar4 < this->N) {
                  piVar26 = this->K[2] + lVar25 + 3999;
                  do {
                    uVar15 = this->K[2][uVar4];
                    if ((uVar15 == uVar17) || (uVar15 == uVar20)) {
                      piVar29 = piVar26 + 4000;
                      if (*piVar26 == 0) {
                        piVar29 = piVar26;
                      }
                      *piVar29 = uVar4 + 1;
                    }
                    piVar26 = piVar26 + 1;
                    uVar5 = uVar5 + 1;
                  } while ((int)uVar4 < this->N);
                }
                if (this->K[3][(long)(int)uVar5 + 3999] == 0) {
                  this->K[3][(long)(int)uVar5 + 3999] = this->K[2][(long)(int)uVar5 + 3999];
                }
              }
            }
          }
          uVar4 = uVar5 + 1;
        } while ((int)uVar5 < this->N);
      }
      break;
    default:
      if (MEDIT - 0x1fU < 2) {
        iVar28 = MSTU[2] + this->N;
        dVar3 = ULANGL(this,*(double *)((long)(this->P + -1) + ((long)MSTU[0x3c] * 2 + 0x1f3e) * 4),
                       this->P[0][(long)MSTU[0x3c] + 3999]);
        psVar12 = this;
        LUDBRB(this,1,iVar28,0.0,-dVar3,0.0,0.0,0.0,false);
        iVar28 = MSTU[2] + this->N;
        dVar3 = ULANGL(psVar12,this->P[1][(long)MSTU[0x3c] + 3999],
                       *(double *)((long)(this->P + -1) + ((long)MSTU[0x3c] * 2 + 0x1f3e) * 4));
        psVar12 = this;
        LUDBRB(this,1,iVar28,-dVar3,0.0,0.0,0.0,0.0,false);
        iVar28 = MSTU[2] + this->N;
        dVar3 = this->P[0][MSTU[0x3c]];
        dVar3 = ULANGL(psVar12,dVar3,dVar3);
        psVar12 = this;
        LUDBRB(this,1,iVar28,0.0,-dVar3,0.0,0.0,0.0,false);
        if (MEDIT != 0x1f) {
          dStack_78 = 0.0;
          PTS[0] = 0.0;
          PTS[1] = 0.0;
          iVar28 = this->N;
          if (0 < iVar28) {
            lVar25 = 0;
            do {
              iVar28 = MSTU[0x28];
              if (0xfffffff5 < this->K[0][lVar25] - 0xbU) {
                if (1 < MSTU[0x28]) {
                  iVar27 = this->K[1][lVar25];
                  uVar4 = LUCOMP(psVar12,iVar27);
                  uVar5 = uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f;
                  if (((uVar5 - 6 < 4) || (uVar5 == 0)) ||
                     ((iVar28 != 2 &&
                      ((KCHG[0][(long)(int)uVar4 + 499] == 0 &&
                       (iVar28 = LUCHGE(psVar12,iVar27), iVar28 == 0)))))) goto LAB_0010e68f;
                }
                pdVar24 = this->P[2] + lVar25;
                uVar18 = (ulong)(*pdVar24 <= 0.0 && *pdVar24 != 0.0);
                NS[uVar18 - 2] = NS[uVar18 - 2] + 1;
                dVar3 = this->P[0][lVar25];
                dVar2 = this->P[1][lVar25];
                dVar3 = dVar3 * dVar3 + dVar2 * dVar2;
                if (dVar3 < 0.0) {
                  dVar3 = sqrt(dVar3);
                }
                else {
                  dVar3 = SQRT(dVar3);
                }
                PTS[uVar18 - 1] = dVar3 + PTS[uVar18 - 1];
              }
LAB_0010e68f:
              lVar25 = lVar25 + 1;
              iVar28 = this->N;
            } while (lVar25 < iVar28);
          }
          if (PTS[0] * 0.0 * PTS[0] < dStack_78 * 0.0 * dStack_78) {
            psVar12 = this;
            LUDBRB(this,1,iVar28 + MSTU[2],PARU[0],0.0,0.0,0.0,0.0,false);
          }
          iVar28 = this->N;
          if (0 < iVar28) {
            lVar25 = 0;
            do {
              iVar28 = MSTU[0x28];
              if ((this->P[2][lVar25] < 0.0) && (0xfffffff5 < this->K[0][lVar25] - 0xbU)) {
                if (1 < MSTU[0x28]) {
                  iVar27 = this->K[1][lVar25];
                  uVar4 = LUCOMP(psVar12,iVar27);
                  uVar5 = uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f;
                  if (((uVar5 - 6 < 4) || (uVar5 == 0)) ||
                     ((iVar28 != 2 &&
                      ((KCHG[0][(long)(int)uVar4 + 499] == 0 &&
                       (iVar28 = LUCHGE(psVar12,iVar27), iVar28 == 0)))))) goto LAB_0010e7b1;
                }
                pdVar24 = this->P[0] + lVar25;
                uVar18 = (ulong)(*pdVar24 <= 0.0 && *pdVar24 != 0.0);
                PTS[uVar18 + 1] = PTS[uVar18 + 1] - this->P[2][lVar25];
              }
LAB_0010e7b1:
              lVar25 = lVar25 + 1;
              iVar28 = this->N;
            } while (lVar25 < iVar28);
          }
          if (PTS[1] < 0.0) {
            LUDBRB(this,1,iVar28 + MSTU[2],0.0,PARU[0],0.0,0.0,0.0,false);
            return;
          }
        }
      }
      break;
    case 0x15:
      if (this->N * 2 < MSTU[3]) {
        MSTU[0x1f] = this->N;
        if (0 < MSTU[0x1f]) {
          lVar25 = 0x1d4c4;
          lVar13 = 0;
          lVar30 = 0;
          do {
            lVar14 = 0x9c44;
            lVar16 = lVar25;
            do {
              *(undefined4 *)((long)this + lVar14 + -40000 + (MSTU[3] + lVar13) * 4) =
                   *(undefined4 *)((long)this + lVar16 + -120000);
              lVar19 = (long)MSTU[3];
              *(undefined8 *)((long)(this->K + -1) + 0x3e7c + lVar14 * 2 + (lVar19 + lVar13) * 8) =
                   *(undefined8 *)((long)this + lVar16 * 2 + -160000);
              *(undefined8 *)((long)this->P[2] + lVar14 * 2 + (lVar19 + lVar13) * 8 + 0x3e78) =
                   *(undefined8 *)((long)(this->K + -1) + 0x3e7c + lVar16 * 2);
              lVar16 = lVar16 + 16000;
              lVar14 = lVar14 + 16000;
            } while (lVar14 != 0x1d4c4);
            lVar30 = lVar30 + 1;
            MSTU[0x1f] = this->N;
            lVar25 = lVar25 + 4;
            lVar13 = lVar13 + -1;
          } while (lVar30 < MSTU[0x1f]);
        }
      }
      else {
        psVar12 = (sophia_interface *)local_a8;
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,"(LUEDIT:) no more memory left in LUJETS","");
        LUERRM(psVar12,0xb,(string *)local_a8);
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0]);
        }
      }
      break;
    case 0x16:
      if (0 < MSTU[0x1f]) {
        paiVar7 = this->K;
        padVar9 = this->P;
        lVar25 = 0;
        lVar13 = 0;
        do {
          lVar30 = 0;
          do {
            *(undefined4 *)((long)*paiVar7 + lVar30) =
                 *(undefined4 *)((long)this->K[0] + lVar30 + (MSTU[3] + lVar25) * 4);
            lVar16 = (long)MSTU[3];
            *(undefined8 *)((long)*padVar9 + lVar30 * 2) =
                 *(undefined8 *)((long)this->P[0] + lVar30 * 2 + (lVar16 + lVar25) * 8);
            *(undefined8 *)((long)padVar9[5] + lVar30 * 2) =
                 *(undefined8 *)((long)this->V[0] + lVar30 * 2 + (lVar16 + lVar25) * 8);
            lVar30 = lVar30 + 16000;
          } while (lVar30 != 80000);
          lVar13 = lVar13 + 1;
          lVar25 = lVar25 + -1;
          paiVar7 = (int (*) [4000])(*paiVar7 + 1);
          padVar9 = (double (*) [4000])(*padVar9 + 1);
        } while (lVar13 < MSTU[0x1f]);
      }
      this->N = MSTU[0x1f];
      break;
    case 0x17:
      iVar28 = this->N;
      iVar27 = 0;
      if (0 < (long)iVar28) {
        lVar25 = 1;
        do {
          iVar8 = this->K[1][lVar25 + 3999];
          iVar10 = iVar8;
          if ((0 < iVar8) && (iVar10 = 0, this->K[0][iVar8 - 1] < 0x15)) {
            iVar10 = iVar8;
          }
          if (iVar10 == 0) {
            iVar27 = iVar27 + 1;
            iVar8 = *(int *)((long)(this->K + -1) + 0x3e7c + lVar25 * 4);
            if (iVar8 - 0xbU < 10) {
              *(int *)((long)(this->K + -1) + 0x3e7c + lVar25 * 4) = iVar8 + -10;
            }
          }
        } while ((iVar10 == 0) && (bVar31 = iVar28 != lVar25, lVar25 = lVar25 + 1, bVar31));
      }
      this->N = iVar27;
    }
  }
  return;
}

Assistant:

void sophia_interface::LUEDIT(int MEDIT) {
// Purpose: to perform global manipulations on the event record,
// in particular to exclude unstable or undetectable partons/particles.
    int NS[2];
    double PTS[2];
    double PLS[2];

    // Remove unwanted partons/particles.
    if ((MEDIT >= 0 && MEDIT <= 3) || MEDIT == 5) {
        int IMAX = N;
        if (MSTU[1] > 0) IMAX = MSTU[1];
        int I1 = std::max(1, MSTU[0]) - 1;
        for (int I = std::max(1, MSTU[0]) - 1; I < IMAX; ++I) {
            if (K[0][I] == 0 || K[0][I] > 20) continue;
            if (MEDIT == 1) {
                if (K[0][I] > 10) continue;
            } else if (MEDIT == 2) {
                if (K[0][I] > 10) continue;
                int KC = LUCOMP(K[1][I]);
                if (KC == 0 || KC == 12 || KC == 14 || KC == 16 || KC == 18) continue;
            } else if (MEDIT == 3) {
                if (K[0][I] > 10) continue;
                int KC = LUCOMP(K[1][I]);
                if (KC == 0) continue;
                if (KCHG[1][KC - 1] == 0 && LUCHGE(K[1][I]) == 0) continue;
            } else if (MEDIT == 5) {
                if (K[0][I] == 13 || K[0][I] == 14) continue;
                int KC = LUCOMP(K[1][I]);
                if (KC == 0) continue;
                if (K[0][I] >= 11 && KCHG[1][KC - 1] == 0) continue;
            }

            // Pack remaining partons/particles. Origin no longer known.
            I1++;
            for (int J = 0; J < 5; ++J) {
                K[J][I1 - 1] = K[J][I];
                P[J][I1 - 1] = P[J][I];
                V[J][I1 - 1] = V[J][I];
            }
            K[2][I1 - 1] = 0;
        } 
        if (I1 < N) MSTU[2] = 0;
        if (I1 < N) MSTU[69] = 0;
        N = I1;
 
        // Selective removal of class of entries. New position of retained. 
        } else if (MEDIT >= 11 && MEDIT <= 15) {
            int I1 = 0;
            for (int I = 0; I < N; ++I) {
                K[2][I] = K[2][I] % MSTU[4];
                if (MEDIT == 11 && K[0][I] < 0) continue;
                if (MEDIT == 12 && K[0][I] == 0) continue;
                if (MEDIT == 13 && (K[0][I] == 11 || K[0][I] == 12 || K[0][I] == 15) && K[1][I] != 94) continue;
                if (MEDIT == 14 && (K[0][I] == 13 || K[0][I] == 14 || K[1][I] == 94)) continue;
                if (MEDIT == 15 && K[0][I] >= 21) continue;
                I1++;
                K[2][I] = K[2][I] + MSTU[4] * I1;
            }

            // Find new event history information and replace old.
            for (int I = 1; I < N + 1; ++I) { 
                if (K[0][I - 1] <= 0 || K[0][I - 1] > 20 || K[2][I - 1] / MSTU[4] == 0) continue;
                int ID = I;
                int IM = 0;
                bool repeat130 = false;
                do {
                    repeat130 = false;
                    IM = K[2][ID - 1] % MSTU[4];
                    if (MEDIT == 13 && IM > 0 && IM <= N) {
                        if ((K[0][IM - 1] == 11 || K[0][IM - 1] == 12 || K[0][IM - 1] == 15) && K[1][IM - 1] != 94) {
                            ID = IM;
                            repeat130 = true;
                            continue;
                        }
                    } else if (MEDIT == 14 && IM > 0 && IM <= N) {
                        if (K[0][IM - 1] == 13 || K[0][IM - 1] == 14 || K[1][IM - 1] == 94) {
                            ID = IM;
                            repeat130 = true;
                            continue;
                        }
                    }
                } while (repeat130);

                K[2][I - 1] = MSTU[4] * (K[2][I - 1] / MSTU[4]);
                if (IM != 0) K[2][I - 1] += K[2][IM - 1] / MSTU[4];
                if (K[0][I - 1] != 3 && K[0][I - 1] != 13 && K[0][I - 1] != 14) {
                    if (K[3][I - 1] > 0 && K[3][I - 1] <= MSTU[3]) K[3][I - 1] = K[2][K[3][I - 1] - 1] / MSTU[4];
                    if (K[4][I - 1] > 0 && K[4][I - 1] <= MSTU[3]) K[4][I - 1] = K[2][K[4][I - 1] - 1] / MSTU[4];
                } else {
                    int KCM = (K[3][I - 1] / MSTU[4]) % MSTU[4];
                    if (KCM > 0 && KCM <= MSTU[3]) KCM = K[2][KCM - 1] / MSTU[4];
                    int KCD = K[3][I - 1] % MSTU[4];
                    if (KCD > 0 && KCD <= MSTU[3]) KCD = K[2][KCD - 1] / MSTU[4];
                    K[3][I - 1] = MSTU[4] * MSTU[4] * (K[3][I - 1] / (MSTU[4] * MSTU[4])) + MSTU[4] * KCM + KCD;
                    KCM = (K[4][I - 1] / MSTU[4]) % MSTU[4];
                    if (KCM > 0 && KCM <= MSTU[3]) KCM = K[2][KCM - 1] / MSTU[4];
                    KCD = K[4][I - 1] % MSTU[4];
                    if (KCD > 0 && KCD <= MSTU[3]) KCD = K[2][KCD - 1] / MSTU[4];
                    K[4][I - 1] = MSTU[4] * MSTU[4] * (K[4][I - 1] / (MSTU[4] * MSTU[4])) + MSTU[4] * KCM + KCD;
                }
            }

            // Pack remaining entries. 
            I1 = 0;
            int MSTU90 = MSTU[89];
            MSTU[89] = 0;
            for (int I = 0; I < N; ++I) {
                if (K[2][I] / MSTU[4] == 0) continue;
                I1++;
                for (int J = 0; J < 5; ++J) {
                    K[J][I1 - 1] = K[J][I];
                    P[J][I1 - 1] = P[J][I];
                    V[J][I1 - 1] = V[J][I];
                }
                K[2][I1 - 1] = K[2][I1 - 1] % MSTU[4]; 
                for (int IZ = 0; IZ < MSTU90; ++IZ) {
                    if (I + 1 == MSTU[90 + IZ]) {
                        MSTU[89]++;
                        MSTU[89 + MSTU[89]] = I1;
                        PARU[89 + MSTU[89]] = PARU[90 + IZ];
                    }
                }
            }
            if (I1 < N) MSTU[2] = 0;
            if (I1 < N) MSTU[69] = 0;
            N = I1;

        // Fill in some missing daughter pointers (lost in colour flow). 
        } else if (MEDIT == 16) {
            for (int I = 1; I < N + 1; ++I) {
                if (K[0][I - 1] <= 10 || K[0][I - 1] > 20) continue;
                if (K[3][I - 1] != 0 || K[4][I - 1] != 0) continue;

                // Find daughters who point to mother.
                for (int I1 = I + 1; I1 < N + 1; ++I1) {
                    if (K[2][I1 - 1] != I) {
                        // do nothing
                    } else if (K[3][I - 1] == 0) {
                        K[3][I - 1] = I1;
                    } else {
                        K[4][I - 1] = I1;
                    }
                }
                if (K[4][I - 1] == 0) K[4][I - 1] = K[3][I - 1];
                if (K[3][I - 1] != 0) continue;

                // Find daughters who point to documentation version of mother.    
                int IM = K[2][I - 1];
                if (IM <= 0 || IM >= I) continue;
                if (K[0][IM - 1] <= 20 || K[0][IM - 1] > 30) continue;
                if (K[1][IM - 1] != K[1][I - 1] || std::abs(P[4][IM - 1] - P[4][I - 1]) > 1e-2) continue;
                for (int I1 = I + 1; I1 < N + 1; ++I1) {
                    if (K[2][I1 - 1] != IM) {
                        // do nothing
                    } else if (K[3][I - 1] == 0) {
                      K[3][I - 1] = I1;
                    } else {
                      K[4][I - 1] = I1;
                    }
                }
                if (K[4][I - 1] == 0) K[4][I - 1] = K[3][I - 1];
                if (K[3][I - 1] != 0) continue;

                // Find daughters who point to documentation daughters who,
                // in their turn, point to documentation mother.
                int ID1 = IM;
                int ID2 = IM;
                for (int I1 = IM + 1; I1 < I; ++I1) {
                    if (K[2][I1 - 1] == IM && K[0][I1 - 1] > 20 && K[0][I1 - 1] <= 30) {
                        ID2 = I1;
                        if (ID1 == IM) ID1 = I1;
                    }
                }
                for (int I1 = I + 1; I1 < N + 1; ++I) {
                    if (K[2][I1 - 1] != ID1 && K[2][I1 - 1] != ID2) {
                    } else if (K[3][I - 1] == 0) {
                        K[3][I - 1] = I1;
                    } else {
                        K[4][I - 1] = I1;
                    }
                }
                if (K[4][I - 1] == 0) K[4][I - 1] = K[3][I - 1];
            }

        // Save top entries at bottom of LUJETS common block.
        } else if (MEDIT == 21) {
            if (2 * N >= MSTU[3]) {
                LUERRM(11, "(LUEDIT:) no more memory left in LUJETS");
                return;
            }
            for (int I = 0; I < N; ++I) {
                for (int J = 0; J < 5; ++J) {
                    K[J][MSTU[3] - I] = K[J][I];
                    P[J][MSTU[3] - I] = P[J][I];
                    V[J][MSTU[3] - I] = V[J][I];
                }
            }
            MSTU[31] = N;

        // Restore bottom entries of common block LUJETS to top.
        } else if (MEDIT == 22) {
            for (int I = 0; I < MSTU[31]; ++I) {
                for (int J = 0; J < 5; ++J) {
                    K[J][I] = K[J][MSTU[3] - I];
                    P[J][I] = P[J][MSTU[3] - I];
                    V[J][I] = V[J][MSTU[3] - I];
                }
            }
            N = MSTU[31];

        // Mark primary entries at top of common block LUJETS as untreated.
        } else if (MEDIT == 23) {
            int I1 = 0;
            for (int I = 0; I < N; ++I) {
                int KH = K[2][I];
                if (KH >= 1) {
                    if (K[0][KH - 1] > 20) KH = 0;
                }
                if (KH != 0) break;
                I1++;
                if (K[0][I] > 10 && K[0][I] <= 20) K[0][I] -= 10;
            }
            N = I1;

        // Place largest axis along z axis and second largest in xy plane.
        } else if (MEDIT == 31 || MEDIT == 32) {
            LUDBRB(1, N + MSTU[2], 0., -ULANGL(P[0][MSTU[60] - 1], P[1][MSTU[60] - 1]), 0., 0., 0.);
            LUDBRB(1, N + MSTU[2], -ULANGL(P[2][MSTU[60] - 1], P[0][MSTU[60] - 1]), 0., 0., 0., 0.);
            LUDBRB(1, N + MSTU[2], 0., -ULANGL(P[0][MSTU[60]], P[0][MSTU[60]]), 0., 0., 0.);
            if (MEDIT == 31) return;
 
            // Rotate to put slim jet along +z axis. 
            for (int IS = 0; IS < 2; ++IS) {
                NS[IS] = 0;
                PTS[IS] = 0.;
                PLS[IS] = 0.;
            }
            for (int I = 0; I < N; ++I) {
                if (K[0][I] <= 0 || K[0][I] > 10) continue;
                if (MSTU[40] >= 2) {
                    int KC = LUCOMP(K[1][I]);
                    if (KC == 0 || KC == 12 || KC == 14 || KC == 16 || KC == 18) continue;
                    if (MSTU[40] >= 3 && KCHG[1][KC - 1] == 0 && LUCHGE(K[1][I]) == 0) continue;
                }
                int IS = (P[2][I] < 0)? 2 : 1;  // this is the most meaningful expression I could derive from: int IS = 2. - SIGN(0.5, P[2][I])
                NS[IS - 1]++;
                PTS[IS - 1] += std::sqrt(P[0][I] * P[0][I] + P[1][I] * P[1][I]);
            }
            if (NS[0] * PTS[1] * PTS[1] < NS[1] * PTS[0] * PTS[0]) LUDBRB(1, N + MSTU[2], PARU[0], 0., 0., 0., 0.);

            // Rotate to put second largest jet into -z,+x quadrant.
            for (int I = 0; I < N; ++I) {
                if (P[2][I] >= 0.) continue;
                if (K[0][I] <= 0 || K[0][I] > 10) continue;
                if (MSTU[40] >= 2) {
                    int KC = LUCOMP(K[1][I]);
                    if (KC == 0 || KC == 12 || KC == 14 || KC == 16 || KC == 18) continue;
                    if (MSTU[40] >= 3 && KCHG[1][KC - 1] == 0 && LUCHGE(K[1][I]) == 0) continue;
                }
                int IS = (P[0][I] < 0)? 2 : 1;  // this is the most meaningful expression I could derive from: int IS = 2. - SIGN(0.5, P[2][I])
                PLS[IS - 1] -= P[2][I];
            }
            if (PLS[1] > PLS[0]) LUDBRB(1, N + MSTU[2], 0., PARU[0], 0., 0., 0.);
      }
      return;
}